

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

UBool __thiscall
icu_63::ReorderingBuffer::resize(ReorderingBuffer *this,int32_t appendLength,UErrorCode *errorCode)

{
  UChar *pUVar1;
  UChar *pUVar2;
  int32_t iVar3;
  char16_t *pcVar4;
  int32_t newLength;
  bool bVar5;
  int32_t local_34;
  int32_t doubleCapacity;
  int32_t newCapacity;
  int32_t length;
  int32_t reorderStartIndex;
  UErrorCode *errorCode_local;
  int32_t appendLength_local;
  ReorderingBuffer *this_local;
  
  pUVar1 = this->reorderStart;
  pUVar2 = this->start;
  newLength = (int32_t)((long)this->limit - (long)this->start >> 1);
  UnicodeString::releaseBuffer(this->str,newLength);
  iVar3 = UnicodeString::getCapacity(this->str);
  local_34 = newLength + appendLength;
  if (newLength + appendLength < iVar3 << 1) {
    local_34 = iVar3 << 1;
  }
  if (local_34 < 0x100) {
    local_34 = 0x100;
  }
  pcVar4 = UnicodeString::getBuffer(this->str,local_34);
  this->start = pcVar4;
  bVar5 = this->start != (UChar *)0x0;
  if (bVar5) {
    this->reorderStart = this->start + (int)((long)pUVar1 - (long)pUVar2 >> 1);
    this->limit = this->start + newLength;
    iVar3 = UnicodeString::getCapacity(this->str);
    this->remainingCapacity = iVar3 - newLength;
  }
  else {
    *errorCode = U_MEMORY_ALLOCATION_ERROR;
  }
  return bVar5;
}

Assistant:

UBool ReorderingBuffer::resize(int32_t appendLength, UErrorCode &errorCode) {
    int32_t reorderStartIndex=(int32_t)(reorderStart-start);
    int32_t length=(int32_t)(limit-start);
    str.releaseBuffer(length);
    int32_t newCapacity=length+appendLength;
    int32_t doubleCapacity=2*str.getCapacity();
    if(newCapacity<doubleCapacity) {
        newCapacity=doubleCapacity;
    }
    if(newCapacity<256) {
        newCapacity=256;
    }
    start=str.getBuffer(newCapacity);
    if(start==NULL) {
        // getBuffer() already did str.setToBogus()
        errorCode=U_MEMORY_ALLOCATION_ERROR;
        return FALSE;
    }
    reorderStart=start+reorderStartIndex;
    limit=start+length;
    remainingCapacity=str.getCapacity()-length;
    return TRUE;
}